

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O2

void __thiscall amrex::AmrMesh::ChopGrids(AmrMesh *this,int lev,BoxArray *ba,int target_size)

{
  pointer pIVar1;
  element_type *peVar2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  BoxArray *pBVar8;
  int idim;
  ulong uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  IntVect chunk;
  int local_48;
  int iStack_44;
  
  if ((((this->super_AmrInfo).refine_grid_layout_dims.vect[0] != 0) ||
      ((this->super_AmrInfo).refine_grid_layout_dims.vect[1] != 0)) ||
     ((this->super_AmrInfo).refine_grid_layout_dims.vect[2] != 0)) {
    pIVar1 = (this->super_AmrInfo).max_grid_size.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    chunk.vect[2] = pIVar1[lev].vect[2];
    chunk.vect._0_8_ = *(undefined8 *)pIVar1[lev].vect;
    do {
      iVar6 = chunk.vect[2];
      uVar5 = chunk.vect._0_8_;
      peVar2 = (ba->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((long)target_size <=
          ((long)*(pointer *)
                  ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data + 8) -
          *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data) / 0x1c) {
        return;
      }
      pBVar8 = (BoxArray *)(ulong)(uint)chunk.vect[2];
      for (uVar9 = 2; -1 < (int)uVar9; uVar9 = (ulong)((int)uVar9 - 1)) {
        if ((this->super_AmrInfo).refine_grid_layout_dims.vect[uVar9] != 0) {
          uVar4 = (long)chunk.vect[uVar9] / 2;
          peVar2 = (ba->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pBVar8 = (BoxArray *)
                   (((long)*(pointer *)
                            ((long)&(peVar2->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data + 8) -
                    *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data) / 0x1c);
          if ((long)pBVar8 < (long)target_size) {
            iVar11 = (int)uVar4;
            lVar3 = (long)(this->super_AmrInfo).blocking_factor.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start[lev].vect[uVar9];
            uVar4 = (ulong)(uint)(iVar11 >> 0x1f) << 0x20 | uVar4 & 0xffffffff;
            pBVar8 = (BoxArray *)((long)uVar4 / lVar3 & 0xffffffff);
            if ((int)((long)uVar4 % lVar3) == 0) {
              chunk.vect[uVar9] = iVar11;
              pBVar8 = BoxArray::maxSize(ba,&chunk);
            }
          }
        }
      }
      local_48 = (int)uVar5;
      iStack_44 = SUB84(uVar5,4);
      auVar10._0_4_ = -(uint)(chunk.vect[0] == local_48);
      iVar11 = -(uint)(chunk.vect[1] == iStack_44);
      auVar10._4_4_ = auVar10._0_4_;
      auVar10._8_4_ = iVar11;
      auVar10._12_4_ = iVar11;
      uVar7 = movmskpd((int)pBVar8,auVar10);
    } while ((((uVar7 & 1) == 0) || ((byte)((byte)uVar7 >> 1) == 0)) || (chunk.vect[2] != iVar6));
  }
  return;
}

Assistant:

void
AmrMesh::ChopGrids (int lev, BoxArray& ba, int target_size) const
{
    if (refine_grid_layout_dims == 0) { return; }

    IntVect chunk = max_grid_size[lev];

    while (ba.size() < target_size)
    {
        IntVect chunk_prev = chunk;

        for (int idim = AMREX_SPACEDIM-1; idim >=0; idim--){
            if (refine_grid_layout_dims[idim]){
                int new_chunk_size = chunk[idim] / 2;
                if ( (ba.size() < target_size) && (new_chunk_size%blocking_factor[lev][idim] == 0))
                {
                    chunk[idim] = new_chunk_size;
                    ba.maxSize(chunk);
                }
            }
        }

        if (chunk == chunk_prev){
            break;
        }
    }

}